

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point2f __thiscall
pbrt::PiecewiseConstant2D::Sample(PiecewiseConstant2D *this,Point2f *u,Float *pdf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  Float pdfs [2];
  int y;
  float local_44;
  float local_40;
  int local_3c;
  Float local_38;
  undefined1 extraout_var [60];
  
  local_38 = PiecewiseConstant1D::Sample
                       (&this->pMarginal,(u->super_Tuple2<pbrt::Point2,_float>).y,&local_40,
                        &local_3c);
  auVar2._0_4_ = PiecewiseConstant1D::Sample
                           ((this->pConditionalY).ptr + local_3c,
                            (u->super_Tuple2<pbrt::Point2,_float>).x,&local_44,(int *)0x0);
  auVar2._4_60_ = extraout_var;
  if (pdf != (Float *)0x0) {
    *pdf = local_44 * local_40;
  }
  auVar1 = vinsertps_avx(auVar2._0_16_,ZEXT416((uint)local_38),0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, Float *pdf = nullptr) const {
        Float pdfs[2];
        int y;
        Float d1 = pMarginal.Sample(u[1], &pdfs[1], &y);
        Float d0 = pConditionalY[y].Sample(u[0], &pdfs[0]);
        if (pdf != nullptr)
            *pdf = pdfs[0] * pdfs[1];
        return Point2f(d0, d1);
    }